

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_bitread.c
# Opt level: O0

MPP_RET mpp_skip_bits(BitReadCtx_t *bitctx,RK_S32 num_bits)

{
  MPP_RET MVar1;
  int local_20;
  RK_S32 bits_left;
  RK_S32 num_bits_local;
  BitReadCtx_t *bitctx_local;
  
  local_20 = num_bits;
  do {
    if (local_20 <= bitctx->num_remaining_bits_in_curr_byte_) {
      bitctx->num_remaining_bits_in_curr_byte_ = bitctx->num_remaining_bits_in_curr_byte_ - local_20
      ;
      bitctx->used_bits = num_bits + bitctx->used_bits;
      return MPP_OK;
    }
    local_20 = local_20 - bitctx->num_remaining_bits_in_curr_byte_;
    MVar1 = (*bitctx->update_curbyte)(bitctx);
  } while (MVar1 == MPP_OK);
  return MPP_ERR_READ_BIT;
}

Assistant:

MPP_RET mpp_skip_bits(BitReadCtx_t *bitctx, RK_S32 num_bits)
{
    RK_S32 bits_left = num_bits;

    while (bitctx->num_remaining_bits_in_curr_byte_ < bits_left) {
        // Take all that's left in current byte, shift to make space for the rest.
        bits_left -= bitctx->num_remaining_bits_in_curr_byte_;
        if (bitctx->update_curbyte(bitctx)) {
            return  MPP_ERR_READ_BIT;
        }
    }
    bitctx->num_remaining_bits_in_curr_byte_ -= bits_left;
    bitctx->used_bits += num_bits;

    return MPP_OK;
}